

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# transpose.hpp
# Opt level: O1

void qclab::dense::operateInPlace<qclab::dense::SquareMatrix<std::complex<float>>>
               (Op op,SquareMatrix<std::complex<float>_> *A)

{
  long lVar1;
  complex<float> *pcVar2;
  _ComplexT _Var3;
  long lVar4;
  int64_t j;
  long lVar5;
  long lVar6;
  long lVar7;
  long lVar8;
  bool bVar9;
  
  if (op != NoTrans) {
    lVar1 = A->size_;
    if (0 < lVar1 && op == ConjTrans) {
      lVar4 = 0;
      lVar5 = 0;
      do {
        lVar6 = 0;
        do {
          lVar7 = A->size_ * lVar4;
          pcVar2 = (A->data_)._M_t.
                   super___uniq_ptr_impl<std::complex<float>,_std::default_delete<std::complex<float>[]>_>
                   ._M_t.
                   super__Tuple_impl<0UL,_std::complex<float>_*,_std::default_delete<std::complex<float>[]>_>
                   .super__Head_base<0UL,_std::complex<float>_*,_false>._M_head_impl;
          *(ulong *)((long)&pcVar2[lVar6]._M_value + lVar7) =
               CONCAT44(*(undefined4 *)((long)&pcVar2[lVar6]._M_value + lVar7 + 4),
                        (int)*(_ComplexT *)((long)&pcVar2[lVar6]._M_value + lVar7)) ^
               0x8000000000000000;
          lVar6 = lVar6 + 1;
        } while (lVar1 != lVar6);
        lVar5 = lVar5 + 1;
        lVar4 = lVar4 + 8;
      } while (lVar5 != lVar1);
    }
    if (1 < lVar1) {
      lVar5 = 0;
      lVar4 = 0;
      do {
        lVar6 = lVar4 + 1;
        do {
          pcVar2 = (A->data_)._M_t.
                   super___uniq_ptr_impl<std::complex<float>,_std::default_delete<std::complex<float>[]>_>
                   ._M_t.
                   super__Tuple_impl<0UL,_std::complex<float>_*,_std::default_delete<std::complex<float>[]>_>
                   .super__Head_base<0UL,_std::complex<float>_*,_false>._M_head_impl;
          lVar7 = lVar5 * A->size_;
          lVar8 = A->size_ * lVar6;
          _Var3 = *(_ComplexT *)((long)&pcVar2[lVar6]._M_value + lVar7);
          *(_ComplexT *)((long)&pcVar2[lVar6]._M_value + lVar7) = pcVar2[lVar8 + lVar4]._M_value;
          pcVar2[lVar8 + lVar4]._M_value = _Var3;
          lVar6 = lVar6 + 1;
        } while (lVar6 < lVar1);
        lVar5 = lVar5 + 8;
        bVar9 = lVar4 != lVar1 + -2;
        lVar4 = lVar4 + 1;
      } while (bVar9);
    }
  }
  return;
}

Assistant:

void operateInPlace( Op op , T& A ) {
      if ( op == Op::NoTrans ) return ;
      const int64_t rows = A.rows() ;
      const int64_t cols = A.cols() ;
      if constexpr ( qclab::is_complex_v< typename T::value_type > ) {
        if ( op == Op::ConjTrans ) {
          // conjugate
          #pragma omp parallel for
          for ( int64_t j = 0; j < cols; j++ ) {
            for ( int64_t i = 0; i < rows; i++ ) {
              A(i,j) = std::conj( A(i,j) ) ;
            }
          }
        }
      }
      // transpose
      #pragma omp parallel for
      for ( int64_t j = 0; j < cols - 1; j++ ) {
        for ( int64_t i = j + 1; i < rows; i++ ) {
          std::swap( A(i,j) , A(j,i) ) ;
        }
      }
    }